

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementEffects.cpp
# Opt level: O2

void __thiscall Rml::ElementEffects::InstanceEffects(ElementEffects *this)

{
  PropertyId PVar1;
  pointer psVar2;
  pointer psVar3;
  pointer pFVar4;
  element_type *peVar5;
  code *pcVar6;
  bool bVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  RenderManager *render_manager;
  ComputedValues *pCVar11;
  undefined4 extraout_var;
  Property *pPVar12;
  ElementDocument *this_00;
  DecoratorPtrList *pDVar13;
  PropertySource *source;
  DecoratorEntryList *this_01;
  long lVar14;
  char *pcVar15;
  long lVar16;
  pointer pFVar17;
  long lVar18;
  FilterEntryList *this_02;
  ulong uVar19;
  PropertyId local_12b [2];
  allocator<char> local_129;
  DecoratorsPtr decorators_ptr;
  FiltersPtr filters_ptr;
  PropertySource document_source;
  String local_70;
  String local_50;
  
  if (this->effects_dirty == true) {
    this->effects_dirty = false;
    this->effects_data_dirty = true;
    ReleaseEffects(this);
    render_manager = Element::GetRenderManager(this->element);
    if (render_manager == (RenderManager *)0x0) {
      bVar7 = Assert("Decorators are being instanced before a render manager is available. Is this element attached to the document?"
                     ,
                     "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/ElementEffects.cpp"
                     ,0x3e);
      if (!bVar7) {
LAB_0028e96e:
        pcVar6 = (code *)invalidInstructionException();
        (*pcVar6)();
      }
    }
    else {
      pCVar11 = Element::GetComputedValues(this->element);
      if ((((pCVar11->common).field_0x1 & 0x80) != 0) ||
         (uVar10 = *(uint *)&pCVar11->rare, (uVar10 >> 0x19 & 1) != 0)) {
        iVar8 = (*(this->element->super_ScriptInterface).super_Releasable._vptr_Releasable[4])();
        if ((StyleSheet *)CONCAT44(extraout_var,iVar8) == (StyleSheet *)0x0) {
          return;
        }
        local_12b[0] = Decorator;
        local_12b[1] = MaskImage;
        for (lVar16 = 0; lVar16 != 2; lVar16 = lVar16 + 1) {
          PVar1 = local_12b[lVar16];
          pPVar12 = Element::GetLocalProperty(this->element,PVar1);
          if ((pPVar12 != (Property *)0x0) && (pPVar12->unit == DECORATOR)) {
            Property::Get<std::shared_ptr<Rml::DecoratorDeclarationList_const>>
                      ((Property *)&decorators_ptr);
            if (decorators_ptr.
                super___shared_ptr<const_Rml::DecoratorDeclarationList,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr != (element_type *)0x0) {
              ::std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_70,"",(allocator<char> *)&filters_ptr);
              ::std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_50,"",&local_129);
              PropertySource::PropertySource(&document_source,&local_70,0,&local_50);
              ::std::__cxx11::string::~string((string *)&local_50);
              ::std::__cxx11::string::~string((string *)&local_70);
              source = (pPVar12->source).
                       super___shared_ptr<const_Rml::PropertySource,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr;
              if (source == (element_type *)0x0) {
                this_00 = Element::GetOwnerDocument(this->element);
                if (this_00 == (ElementDocument *)0x0) {
                  source = (PropertySource *)0x0;
                }
                else {
                  ElementDocument::GetSourceURL_abi_cxx11_(this_00);
                  source = &document_source;
                  ::std::__cxx11::string::_M_assign((string *)source);
                }
              }
              pDVar13 = StyleSheet::InstanceDecorators
                                  ((StyleSheet *)CONCAT44(extraout_var,iVar8),render_manager,
                                   decorators_ptr.
                                   super___shared_ptr<const_Rml::DecoratorDeclarationList,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr,source);
              psVar2 = (pDVar13->
                       super__Vector_base<std::shared_ptr<const_Rml::Decorator>,_std::allocator<std::shared_ptr<const_Rml::Decorator>_>_>
                       )._M_impl.super__Vector_impl_data._M_start;
              psVar3 = (pDVar13->
                       super__Vector_base<std::shared_ptr<const_Rml::Decorator>,_std::allocator<std::shared_ptr<const_Rml::Decorator>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish;
              if (((psVar2 != psVar3) &&
                  ((long)psVar3 - (long)psVar2 >> 4 !=
                   ((long)((decorators_ptr.
                            super___shared_ptr<const_Rml::DecoratorDeclarationList,_(__gnu_cxx::_Lock_policy)2>
                           ._M_ptr)->list).
                          super__Vector_base<Rml::DecoratorDeclaration,_std::allocator<Rml::DecoratorDeclaration>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)((decorators_ptr.
                           super___shared_ptr<const_Rml::DecoratorDeclarationList,_(__gnu_cxx::_Lock_policy)2>
                          ._M_ptr)->list).
                         super__Vector_base<Rml::DecoratorDeclaration,_std::allocator<Rml::DecoratorDeclaration>_>
                         ._M_impl.super__Vector_impl_data._M_start) / 0x60)) &&
                 (bVar7 = Assert("RMLUI_ASSERT(decorator_list.empty() || decorator_list.size() == decorators_ptr->list.size())"
                                 ,
                                 "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/ElementEffects.cpp"
                                 ,0x61), !bVar7)) goto LAB_0028e96e;
              this_01 = &this->mask_images;
              if (PVar1 == Decorator) {
                this_01 = &this->decorators;
              }
              ::std::
              vector<Rml::ElementEffects::DecoratorEntry,_std::allocator<Rml::ElementEffects::DecoratorEntry>_>
              ::reserve(this_01,((long)((decorators_ptr.
                                         super___shared_ptr<const_Rml::DecoratorDeclarationList,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_ptr)->list).
                                       super__Vector_base<Rml::DecoratorDeclaration,_std::allocator<Rml::DecoratorDeclaration>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                (long)((decorators_ptr.
                                        super___shared_ptr<const_Rml::DecoratorDeclarationList,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr)->list).
                                      super__Vector_base<Rml::DecoratorDeclaration,_std::allocator<Rml::DecoratorDeclaration>_>
                                      ._M_impl.super__Vector_impl_data._M_start) / 0x60);
              lVar14 = 0;
              lVar18 = 0x58;
              for (uVar19 = 0;
                  (psVar2 = (pDVar13->
                            super__Vector_base<std::shared_ptr<const_Rml::Decorator>,_std::allocator<std::shared_ptr<const_Rml::Decorator>_>_>
                            )._M_impl.super__Vector_impl_data._M_start,
                  uVar19 < (ulong)((long)(pDVar13->
                                         super__Vector_base<std::shared_ptr<const_Rml::Decorator>,_std::allocator<std::shared_ptr<const_Rml::Decorator>_>_>
                                         )._M_impl.super__Vector_impl_data._M_finish - (long)psVar2
                                  >> 4) &&
                  (uVar19 < (ulong)(((long)((decorators_ptr.
                                             super___shared_ptr<const_Rml::DecoratorDeclarationList,_(__gnu_cxx::_Lock_policy)2>
                                            ._M_ptr)->list).
                                           super__Vector_base<Rml::DecoratorDeclaration,_std::allocator<Rml::DecoratorDeclaration>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)((decorators_ptr.
                                            super___shared_ptr<const_Rml::DecoratorDeclarationList,_(__gnu_cxx::_Lock_policy)2>
                                           ._M_ptr)->list).
                                          super__Vector_base<Rml::DecoratorDeclaration,_std::allocator<Rml::DecoratorDeclaration>_>
                                          ._M_impl.super__Vector_impl_data._M_start) / 0x60)));
                  uVar19 = uVar19 + 1) {
                if (*(long *)((long)&(psVar2->
                                     super___shared_ptr<const_Rml::Decorator,_(__gnu_cxx::_Lock_policy)2>
                                     )._M_ptr + lVar14) != 0) {
                  filters_ptr.
                  super___shared_ptr<const_Rml::FilterDeclarationList,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr = (element_type *)0x0;
                  filters_ptr.
                  super___shared_ptr<const_Rml::FilterDeclarationList,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                  ::std::__shared_ptr<const_Rml::Decorator,_(__gnu_cxx::_Lock_policy)2>::operator=
                            ((__shared_ptr<const_Rml::Decorator,_(__gnu_cxx::_Lock_policy)2> *)
                             &filters_ptr,
                             (__shared_ptr<const_Rml::Decorator,_(__gnu_cxx::_Lock_policy)2> *)
                             ((long)&(psVar2->
                                     super___shared_ptr<const_Rml::Decorator,_(__gnu_cxx::_Lock_policy)2>
                                     )._M_ptr + lVar14));
                  iVar9 = *(int *)((long)&((((decorators_ptr.
                                              super___shared_ptr<const_Rml::DecoratorDeclarationList,_(__gnu_cxx::_Lock_policy)2>
                                             ._M_ptr)->list).
                                            super__Vector_base<Rml::DecoratorDeclaration,_std::allocator<Rml::DecoratorDeclaration>_>
                                            ._M_impl.super__Vector_impl_data._M_start)->type).
                                          _M_dataplus._M_p + lVar18);
                  if (iVar9 == 4) {
                    iVar9 = (PVar1 == Decorator) + 1;
                  }
                  if ((2 < iVar9 - 1U) &&
                     (bVar7 = Assert("RMLUI_ASSERT(entry.paint_area >= BoxArea::Border && entry.paint_area <= BoxArea::Content)"
                                     ,
                                     "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/ElementEffects.cpp"
                                     ,0x72), !bVar7)) goto LAB_0028e96e;
                  ::std::
                  vector<Rml::ElementEffects::DecoratorEntry,_std::allocator<Rml::ElementEffects::DecoratorEntry>_>
                  ::emplace_back<Rml::ElementEffects::DecoratorEntry>
                            (this_01,(DecoratorEntry *)&filters_ptr);
                  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                            (&filters_ptr.
                              super___shared_ptr<const_Rml::FilterDeclarationList,_(__gnu_cxx::_Lock_policy)2>
                              ._M_refcount);
                }
                lVar18 = lVar18 + 0x60;
                lVar14 = lVar14 + 0x10;
              }
              PropertySource::~PropertySource(&document_source);
            }
            ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      (&decorators_ptr.
                        super___shared_ptr<const_Rml::DecoratorDeclarationList,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount);
          }
        }
        uVar10 = *(uint *)&pCVar11->rare;
      }
      if ((uVar10 & 0xc000000) != 0) {
        local_12b[0] = Filter;
        local_12b[1] = BackdropFilter;
        for (lVar16 = 0; lVar16 != 2; lVar16 = lVar16 + 1) {
          PVar1 = local_12b[lVar16];
          pPVar12 = Element::GetLocalProperty(this->element,PVar1);
          if ((pPVar12 != (Property *)0x0) && (pPVar12->unit == FILTER)) {
            Property::Get<std::shared_ptr<Rml::FilterDeclarationList_const>>
                      ((Property *)&filters_ptr);
            if (filters_ptr.
                super___shared_ptr<const_Rml::FilterDeclarationList,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr != (element_type *)0x0) {
              this_02 = &this->backdrop_filters;
              if (PVar1 == Filter) {
                this_02 = &this->filters;
              }
              ::std::
              vector<Rml::ElementEffects::FilterEntry,_std::allocator<Rml::ElementEffects::FilterEntry>_>
              ::reserve(this_02,((long)((filters_ptr.
                                         super___shared_ptr<const_Rml::FilterDeclarationList,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_ptr)->list).
                                       super__Vector_base<Rml::FilterDeclaration,_std::allocator<Rml::FilterDeclaration>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                (long)((filters_ptr.
                                        super___shared_ptr<const_Rml::FilterDeclarationList,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr)->list).
                                      super__Vector_base<Rml::FilterDeclaration,_std::allocator<Rml::FilterDeclaration>_>
                                      ._M_impl.super__Vector_impl_data._M_start) / 0x58);
              pFVar4 = ((filters_ptr.
                         super___shared_ptr<const_Rml::FilterDeclarationList,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr)->list).
                       super__Vector_base<Rml::FilterDeclaration,_std::allocator<Rml::FilterDeclaration>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
              for (pFVar17 = ((filters_ptr.
                               super___shared_ptr<const_Rml::FilterDeclarationList,_(__gnu_cxx::_Lock_policy)2>
                              ._M_ptr)->list).
                             super__Vector_base<Rml::FilterDeclaration,_std::allocator<Rml::FilterDeclaration>_>
                             ._M_impl.super__Vector_impl_data._M_start; pFVar17 != pFVar4;
                  pFVar17 = pFVar17 + 1) {
                (*pFVar17->instancer->_vptr_FilterInstancer[2])
                          (&document_source,pFVar17->instancer,pFVar17,&pFVar17->properties);
                decorators_ptr.
                super___shared_ptr<const_Rml::DecoratorDeclarationList,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr = (element_type *)document_source.path._M_dataplus._M_p;
                decorators_ptr.
                super___shared_ptr<const_Rml::DecoratorDeclarationList,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi =
                     (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     document_source.path._M_string_length;
                document_source.path._M_dataplus._M_p = (pointer)0x0;
                document_source.path._M_string_length = 0;
                ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                          ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                           &document_source.path._M_string_length);
                if (decorators_ptr.
                    super___shared_ptr<const_Rml::DecoratorDeclarationList,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr == (element_type *)0x0) {
                  peVar5 = (pPVar12->source).
                           super___shared_ptr<const_Rml::PropertySource,_(__gnu_cxx::_Lock_policy)2>
                           ._M_ptr;
                  pcVar15 = "";
                  uVar19 = 0xffffffffffffffff;
                  if (peVar5 != (element_type *)0x0) {
                    pcVar15 = (peVar5->path)._M_dataplus._M_p;
                    uVar19 = (ulong)(uint)peVar5->line_number;
                  }
                  Log::Message(LT_WARNING,
                               "Filter \'%s\' in \'%s\' could not be instanced, declared at %s:%d",
                               (pFVar17->type)._M_dataplus._M_p,
                               ((filters_ptr.
                                 super___shared_ptr<const_Rml::FilterDeclarationList,_(__gnu_cxx::_Lock_policy)2>
                                ._M_ptr)->value)._M_dataplus._M_p,pcVar15,uVar19);
                }
                else {
                  document_source.path._M_dataplus._M_p =
                       (pointer)decorators_ptr.
                                super___shared_ptr<const_Rml::DecoratorDeclarationList,_(__gnu_cxx::_Lock_policy)2>
                                ._M_ptr;
                  document_source.path._M_string_length =
                       (size_type)
                       decorators_ptr.
                       super___shared_ptr<const_Rml::DecoratorDeclarationList,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi;
                  decorators_ptr.
                  super___shared_ptr<const_Rml::DecoratorDeclarationList,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr = (element_type *)0x0;
                  decorators_ptr.
                  super___shared_ptr<const_Rml::DecoratorDeclarationList,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                  document_source.path.field_2._M_allocated_capacity = 0;
                  document_source.path.field_2._8_8_ = 0;
                  ::std::
                  vector<Rml::ElementEffects::FilterEntry,_std::allocator<Rml::ElementEffects::FilterEntry>_>
                  ::emplace_back<Rml::ElementEffects::FilterEntry>
                            (this_02,(FilterEntry *)&document_source);
                  FilterEntry::~FilterEntry((FilterEntry *)&document_source);
                }
                ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                          (&decorators_ptr.
                            super___shared_ptr<const_Rml::DecoratorDeclarationList,_(__gnu_cxx::_Lock_policy)2>
                            ._M_refcount);
              }
            }
            ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      (&filters_ptr.
                        super___shared_ptr<const_Rml::FilterDeclarationList,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount);
          }
        }
      }
    }
  }
  return;
}

Assistant:

void ElementEffects::InstanceEffects()
{
	if (!effects_dirty)
		return;

	effects_dirty = false;
	effects_data_dirty = true;

	RMLUI_ZoneScopedC(0xB22222);
	ReleaseEffects();

	RenderManager* render_manager = element->GetRenderManager();
	if (!render_manager)
	{
		RMLUI_ERRORMSG("Decorators are being instanced before a render manager is available. Is this element attached to the document?");
		return;
	}

	const ComputedValues& computed = element->GetComputedValues();

	if (computed.has_decorator() || computed.has_mask_image())
	{
		const StyleSheet* style_sheet = element->GetStyleSheet();
		if (!style_sheet)
			return;

		for (const auto id : {PropertyId::Decorator, PropertyId::MaskImage})
		{
			const Property* property = element->GetLocalProperty(id);
			if (!property || property->unit != Unit::DECORATOR)
				continue;

			DecoratorsPtr decorators_ptr = property->Get<DecoratorsPtr>();
			if (!decorators_ptr)
				continue;

			PropertySource document_source("", 0, "");
			const PropertySource* source = property->source.get();

			if (!source)
			{
				if (ElementDocument* document = element->GetOwnerDocument())
				{
					document_source.path = document->GetSourceURL();
					source = &document_source;
				}
			}

			const DecoratorPtrList& decorator_list = style_sheet->InstanceDecorators(*render_manager, *decorators_ptr, source);
			RMLUI_ASSERT(decorator_list.empty() || decorator_list.size() == decorators_ptr->list.size());

			DecoratorEntryList& decorators_target = (id == PropertyId::Decorator ? decorators : mask_images);
			decorators_target.reserve(decorators_ptr->list.size());

			for (size_t i = 0; i < decorator_list.size() && i < decorators_ptr->list.size(); i++)
			{
				const SharedPtr<const Decorator>& decorator = decorator_list[i];
				if (decorator)
				{
					DecoratorEntry entry;
					entry.decorator_data = 0;
					entry.decorator = decorator;
					entry.paint_area = decorators_ptr->list[i].paint_area;
					if (entry.paint_area == BoxArea::Auto)
						entry.paint_area = (id == PropertyId::Decorator ? BoxArea::Padding : BoxArea::Border);

					RMLUI_ASSERT(entry.paint_area >= BoxArea::Border && entry.paint_area <= BoxArea::Content);
					decorators_target.push_back(std::move(entry));
				}
			}
		}
	}

	if (computed.has_filter() || computed.has_backdrop_filter())
	{
		for (const auto id : {PropertyId::Filter, PropertyId::BackdropFilter})
		{
			const Property* property = element->GetLocalProperty(id);
			if (!property || property->unit != Unit::FILTER)
				continue;

			FiltersPtr filters_ptr = property->Get<FiltersPtr>();
			if (!filters_ptr)
				continue;

			FilterEntryList& list = (id == PropertyId::Filter ? filters : backdrop_filters);
			list.reserve(filters_ptr->list.size());

			for (const FilterDeclaration& declaration : filters_ptr->list)
			{
				SharedPtr<const Filter> filter = declaration.instancer->InstanceFilter(declaration.type, declaration.properties);
				if (filter)
				{
					list.push_back({std::move(filter), CompiledFilter{}});
				}
				else
				{
					const auto& source = property->source;
					Log::Message(Log::LT_WARNING, "Filter '%s' in '%s' could not be instanced, declared at %s:%d", declaration.type.c_str(),
						filters_ptr->value.c_str(), source ? source->path.c_str() : "", source ? source->line_number : -1);
				}
			}
		}
	}
}